

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void Mahony_update(quaternion *q)

{
  float (*pafVar1) [1];
  float fVar2;
  size_t m;
  long lVar3;
  float sum;
  float fVar4;
  float afVar5 [1];
  float h;
  float u2;
  float v2;
  matrix<3UL,_1UL> result;
  matrix<3UL,_1UL> result_6;
  vector<3UL> gyr;
  quaternion local_d0;
  undefined **local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  quaternion local_a0;
  undefined **local_88;
  float local_80 [4];
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  undefined **local_48;
  float local_40 [2] [1];
  float local_38;
  
  physical_model::accelerometer();
  fVar4 = 0.0;
  lVar3 = 2;
  do {
    fVar2 = local_a0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0];
    fVar4 = fVar4 + fVar2 * fVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  local_d0.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00107d80;
  local_d0.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  lVar3 = 2;
  do {
    local_d0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] =
         local_a0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] * (1.0 / fVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  local_4c = local_d0.data.super_matrix<4UL,_1UL>.data[0][0];
  local_54 = local_d0.data.super_matrix<4UL,_1UL>.data[1][0];
  local_50 = local_d0.data.super_matrix<4UL,_1UL>.data[2][0];
  local_a0.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00107d28;
  local_a0.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_a0.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  local_a0.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  local_a0.data.super_matrix<4UL,_1UL>.data[3][0] = 1.0;
  blas::quaternion::rotate_inv(&local_d0,q,&local_a0);
  local_58 = local_d0.data.super_matrix<4UL,_1UL>.data[1][0];
  local_5c = local_d0.data.super_matrix<4UL,_1UL>.data[2][0];
  local_60 = local_d0.data.super_matrix<4UL,_1UL>.data[3][0];
  physical_model::magnetometer();
  fVar4 = 0.0;
  lVar3 = 2;
  do {
    fVar2 = local_a0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0];
    fVar4 = fVar4 + fVar2 * fVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  local_d0.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00107d80;
  local_d0.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  lVar3 = 2;
  do {
    local_d0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] =
         local_a0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] * (1.0 / fVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  local_a0.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00107d28;
  local_64 = local_d0.data.super_matrix<4UL,_1UL>.data[0][0];
  local_a0.data.super_matrix<4UL,_1UL>.data._0_8_ =
       local_d0.data.super_matrix<4UL,_1UL>.data._0_8_ << 0x20;
  local_6c = local_d0.data.super_matrix<4UL,_1UL>.data[1][0];
  local_68 = local_d0.data.super_matrix<4UL,_1UL>.data[2][0];
  local_a0.data.super_matrix<4UL,_1UL>.data[3][0] = local_d0.data.super_matrix<4UL,_1UL>.data[2][0];
  local_a0.data.super_matrix<4UL,_1UL>.data[2][0] = local_d0.data.super_matrix<4UL,_1UL>.data[1][0];
  blas::quaternion::rotate(&local_d0,q,&local_a0);
  fVar4 = local_d0.data.super_matrix<4UL,_1UL>.data[1][0] *
          local_d0.data.super_matrix<4UL,_1UL>.data[1][0] +
          local_d0.data.super_matrix<4UL,_1UL>.data[2][0] *
          local_d0.data.super_matrix<4UL,_1UL>.data[2][0];
  if (fVar4 < 0.0) {
    local_70 = local_d0.data.super_matrix<4UL,_1UL>.data[3][0];
    fVar4 = sqrtf(fVar4);
    afVar5[0] = local_70;
  }
  else {
    fVar4 = SQRT(fVar4);
    afVar5[0] = local_d0.data.super_matrix<4UL,_1UL>.data[3][0];
  }
  local_a0.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00107d28;
  local_a0.data.super_matrix<4UL,_1UL>.data._0_8_ = (ulong)(uint)fVar4 << 0x20;
  local_a0.data.super_matrix<4UL,_1UL>.data._8_8_ = (ulong)(uint)afVar5[0] << 0x20;
  blas::quaternion::rotate_inv(&local_d0,q,&local_a0);
  local_88 = &PTR_to_string_abi_cxx11__00107ce8;
  local_80[1] = local_50 * local_58 - local_60 * local_4c;
  local_80[0] = local_54 * local_60 - local_5c * local_50;
  local_80[2] = local_4c * local_5c - local_58 * local_54;
  local_b8 = &PTR_to_string_abi_cxx11__00107ce8;
  uStack_b0 = CONCAT44(local_68 * local_d0.data.super_matrix<4UL,_1UL>.data[1][0] -
                       local_d0.data.super_matrix<4UL,_1UL>.data[3][0] * local_64,
                       local_6c * local_d0.data.super_matrix<4UL,_1UL>.data[3][0] -
                       local_d0.data.super_matrix<4UL,_1UL>.data[2][0] * local_68);
  uStack_a8._0_4_ =
       local_64 * local_d0.data.super_matrix<4UL,_1UL>.data[2][0] -
       local_d0.data.super_matrix<4UL,_1UL>.data[1][0] * local_6c;
  local_d0.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00107d80;
  local_d0.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  lVar3 = 2;
  do {
    local_d0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] =
         local_80[lVar3 + -2] + *(float *)((long)&local_b8 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  local_a0.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00107ce8;
  local_a0.data.super_matrix<4UL,_1UL>.data[0][0] = local_d0.data.super_matrix<4UL,_1UL>.data[0][0];
  local_a0.data.super_matrix<4UL,_1UL>.data[1][0] = local_d0.data.super_matrix<4UL,_1UL>.data[1][0];
  local_a0.data.super_matrix<4UL,_1UL>.data[2][0] = local_d0.data.super_matrix<4UL,_1UL>.data[2][0];
  physical_model::gyroscope();
  local_d0.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  lVar3 = 2;
  do {
    local_d0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] =
         local_a0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] * 0.02;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  local_40[0][0] = local_d0.data.super_matrix<4UL,_1UL>.data[0][0];
  local_40[1][0] = local_d0.data.super_matrix<4UL,_1UL>.data[1][0];
  local_38 = local_d0.data.super_matrix<4UL,_1UL>.data[2][0];
  local_d0.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  lVar3 = 2;
  do {
    local_d0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] =
         *(float *)((long)&local_48 + lVar3 * 4) * 0.01;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  uStack_b0._0_4_ = local_d0.data.super_matrix<4UL,_1UL>.data[0][0];
  uStack_b0._4_4_ = local_d0.data.super_matrix<4UL,_1UL>.data[1][0];
  uStack_a8._0_4_ = local_d0.data.super_matrix<4UL,_1UL>.data[2][0];
  lVar3 = 2;
  do {
    Mahony_update::integrated_error.super_matrix<3UL,_1UL>.data[lVar3 + -2][0] =
         *(float *)((long)&local_b8 + lVar3 * 4) +
         Mahony_update::integrated_error.super_matrix<3UL,_1UL>.data[lVar3 + -2][0];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  local_d0.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data._8_8_ =
       (ulong)(uint)local_d0.data.super_matrix<4UL,_1UL>.data[3][0] << 0x20;
  lVar3 = 2;
  do {
    local_d0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] =
         local_a0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] * 120.0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  local_48 = &PTR_to_string_abi_cxx11__00107ce8;
  local_40[0][0] = local_d0.data.super_matrix<4UL,_1UL>.data[0][0];
  local_40[1][0] = local_d0.data.super_matrix<4UL,_1UL>.data[1][0];
  local_38 = local_d0.data.super_matrix<4UL,_1UL>.data[2][0];
  uStack_b0._0_4_ = 0.0;
  uStack_b0._4_4_ = 0.0;
  uStack_a8 = (ulong)uStack_a8._4_4_ << 0x20;
  lVar3 = 2;
  do {
    *(float *)((long)&local_b8 + lVar3 * 4) =
         Mahony_update::integrated_error.super_matrix<3UL,_1UL>.data[lVar3 + -2][0] +
         *(float *)((long)&local_48 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  local_d0.data.super_matrix<4UL,_1UL>.data[0][0] = (float)uStack_b0;
  local_d0.data.super_matrix<4UL,_1UL>.data[1][0] = uStack_b0._4_4_;
  local_d0.data.super_matrix<4UL,_1UL>.data[2][0] = uStack_a8._0_4_;
  lVar3 = 2;
  do {
    local_80[lVar3 + -2] =
         local_d0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] + local_80[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  local_d0.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[3][0] = 0.0;
  pafVar1 = (q->data).super_matrix<4UL,_1UL>.data;
  lVar3 = 2;
  do {
    local_d0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] =
         (q->data).super_matrix<4UL,_1UL>.data[lVar3 + -2][0] * 0.5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  local_b8 = &PTR_to_string_abi_cxx11__00107d28;
  uStack_b0 = CONCAT44(local_d0.data.super_matrix<4UL,_1UL>.data[2][0] * local_80[2] +
                       ((local_d0.data.super_matrix<4UL,_1UL>.data[1][0] * 0.0 +
                        local_d0.data.super_matrix<4UL,_1UL>.data[0][0] * local_80[0]) -
                       local_d0.data.super_matrix<4UL,_1UL>.data[3][0] * local_80[1]),
                       ((local_d0.data.super_matrix<4UL,_1UL>.data[0][0] * 0.0 -
                        local_80[0] * local_d0.data.super_matrix<4UL,_1UL>.data[1][0]) -
                       local_d0.data.super_matrix<4UL,_1UL>.data[2][0] * local_80[1]) -
                       local_d0.data.super_matrix<4UL,_1UL>.data[3][0] * local_80[2]);
  uStack_a8 = CONCAT44(local_d0.data.super_matrix<4UL,_1UL>.data[0][0] * local_80[2] +
                       local_d0.data.super_matrix<4UL,_1UL>.data[1][0] * local_80[1] +
                       (local_d0.data.super_matrix<4UL,_1UL>.data[3][0] * 0.0 -
                       local_80[0] * local_d0.data.super_matrix<4UL,_1UL>.data[2][0]),
                       (local_d0.data.super_matrix<4UL,_1UL>.data[0][0] * local_80[1] +
                       local_d0.data.super_matrix<4UL,_1UL>.data[2][0] * 0.0 +
                       local_d0.data.super_matrix<4UL,_1UL>.data[3][0] * local_80[0]) -
                       local_d0.data.super_matrix<4UL,_1UL>.data[1][0] * local_80[2]);
  local_d0.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[3][0] = 0.0;
  lVar3 = 2;
  do {
    local_d0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] =
         *(float *)((long)&local_b8 + lVar3 * 4) * 0.01;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  local_d0.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00107d28;
  lVar3 = 2;
  do {
    (q->data).super_matrix<4UL,_1UL>.data[lVar3 + -2][0] =
         local_d0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] +
         (q->data).super_matrix<4UL,_1UL>.data[lVar3 + -2][0];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  fVar4 = 0.0;
  lVar3 = 0;
  do {
    fVar2 = pafVar1[lVar3][0];
    fVar4 = fVar4 + fVar2 * fVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  local_d0.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  local_d0.data.super_matrix<4UL,_1UL>.data[3][0] = 0.0;
  lVar3 = 2;
  do {
    local_d0.data.super_matrix<4UL,_1UL>.data[lVar3 + -2][0] =
         (q->data).super_matrix<4UL,_1UL>.data[lVar3 + -2][0] * (1.0 / fVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  *(undefined8 *)pafVar1 = local_d0.data.super_matrix<4UL,_1UL>.data._0_8_;
  *(undefined8 *)((q->data).super_matrix<4UL,_1UL>.data + 2) =
       local_d0.data.super_matrix<4UL,_1UL>.data._8_8_;
  return;
}

Assistant:

void Mahony_update(blas::quaternion &q) {
    using blas::quaternion;
    using blas::vector;
    using blas::matrix;

    const float Kp = 120.0, Ki = 0.02;
    static vector<3> integrated_error;

    const vector<3> acc = physical_model::accelerometer().normalized();
    // Assume the real acceleration is pointing to z+,
    // i.e. there is no accelerated motion.
    const vector<3> acc_expect = q.rotate_inv({0, 0, 1});

    const vector<3> mag = physical_model::magnetometer().normalized();
    const vector<3> mag_0 = q.rotate(mag);
    // Decompose into x-y plane(horizontal) and z-axis(vertical).
    const float mag_h = sqrtf(mag_0(0) * mag_0(0) + mag_0(1) * mag_0(1));
    const float mag_v = mag_0(2);
    // Assume the real direction of magnetic field is in surface y=0, pointing to x+,
    // i.e. there is no electromagnetic interference.
    const vector<3> mag_expect = q.rotate_inv({mag_h, 0, mag_v});

    const vector<3> error = acc.cross(acc_expect) + mag.cross(mag_expect);

    vector<3> gyr = physical_model::gyroscope();
    integrated_error += Ki * error * duration;
    gyr += integrated_error + Kp * error;

    // Approximate the integral
    q += 0.5 * q * gyr * duration;
    q = q.normalized();
}